

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_cache_server.cpp
# Opt level: O0

void __thiscall
cppcms::impl::tcp_cache_service::session::session
          (session *this,io_service *srv,intrusive_ptr<cppcms::impl::base_cache> *c,
          shared_ptr<cppcms::sessions::session_storage_factory> *f)

{
  bool bVar1;
  element_type *peVar2;
  __shared_ptr *in_RCX;
  io_service *in_RSI;
  long in_RDI;
  shared_ptr<cppcms::sessions::session_storage> *this_00;
  shared_ptr<cppcms::sessions::session_storage> *in_stack_ffffffffffffff78;
  intrusive_ptr<cppcms::impl::base_cache> *in_stack_ffffffffffffff80;
  undefined1 local_40 [48];
  io_service *local_10;
  
  local_10 = in_RSI;
  std::enable_shared_from_this<cppcms::impl::tcp_cache_service::session>::enable_shared_from_this
            ((enable_shared_from_this<cppcms::impl::tcp_cache_service::session> *)0x483aea);
  std::vector<char,_std::allocator<char>_>::vector((vector<char,_std::allocator<char>_> *)0x483afd);
  std::__cxx11::string::string((string *)(in_RDI + 0x28));
  booster::aio::stream_socket::stream_socket((stream_socket *)(in_RDI + 0x98),local_10);
  booster::intrusive_ptr<cppcms::impl::base_cache>::intrusive_ptr
            (in_stack_ffffffffffffff80,
             (intrusive_ptr<cppcms::impl::base_cache> *)in_stack_ffffffffffffff78);
  this_00 = (shared_ptr<cppcms::sessions::session_storage> *)(in_RDI + 0xd0);
  std::shared_ptr<cppcms::sessions::session_storage>::shared_ptr
            ((shared_ptr<cppcms::sessions::session_storage> *)0x483b60);
  bVar1 = std::__shared_ptr::operator_cast_to_bool(in_RCX);
  if (bVar1) {
    peVar2 = std::
             __shared_ptr_access<cppcms::sessions::session_storage_factory,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<cppcms::sessions::session_storage_factory,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x483b7d);
    (**peVar2->_vptr_session_storage_factory)(local_40);
    std::shared_ptr<cppcms::sessions::session_storage>::operator=(this_00,in_stack_ffffffffffffff78)
    ;
    std::shared_ptr<cppcms::sessions::session_storage>::~shared_ptr
              ((shared_ptr<cppcms::sessions::session_storage> *)0x483baf);
  }
  return;
}

Assistant:

session(io::io_service &srv,
		booster::intrusive_ptr<cppcms::impl::base_cache> c,
		booster::shared_ptr<cppcms::sessions::session_storage_factory> f) :
		socket_(srv),
		cache_(c)
	{
		if(f) {
			sessions_ = f->get();
		}
	}